

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O2

void __thiscall
NodeParser::parseCoords
          (NodeParser *this,Node *node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  bool bVar2;
  InputError *pIVar3;
  string local_88;
  string local_68;
  string local_48;
  allocator local_21;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(tokenList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_88,"",&local_21);
    InputError::InputError(pIVar3,2,&local_88);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  bVar2 = Utilities::parseNumber<double>(pbVar1 + 1,&node->xCoord);
  if (bVar2) {
    bVar2 = Utilities::parseNumber<double>(pbVar1 + 2,&node->yCoord);
    if (bVar2) {
      return;
    }
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_48,(string *)(pbVar1 + 2));
    InputError::InputError(pIVar3,6,&local_48);
    __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
  }
  pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_68,(string *)(pbVar1 + 1));
  InputError::InputError(pIVar3,6,&local_68);
  __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void NodeParser::parseCoords(Node* node, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - node ID
    // 1 - x coordinate
    // 2 - y coordinate

    if ( tokenList.size() < 3 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    if ( !Utilities::parseNumber(tokens[1], node->xCoord) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }
    if ( !Utilities::parseNumber(tokens[2], node->yCoord) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }
}